

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  short sVar1;
  char *pcVar2;
  uint local_54;
  int local_50;
  int len;
  int i;
  short v;
  uchar *d;
  uchar *s;
  uint src_len_local;
  char *src_local;
  uint *datalen_local;
  char **data_local;
  LIBSSH2_SESSION *session_local;
  
  local_50 = 0;
  local_54 = 0;
  pcVar2 = (char *)(*session->alloc)(1,&session->abstract);
  *data = pcVar2;
  pcVar2 = *data;
  d = (uchar *)src;
  if (pcVar2 == (char *)0x0) {
    session_local._4_4_ = _libssh2_error(session,-6,"Unable to allocate memory for base64 decoding")
    ;
  }
  else {
    for (; d < src + src_len; d = d + 1) {
      sVar1 = base64_reverse_table[*d];
      if (-1 < sVar1) {
        switch(local_50 % 4) {
        case 0:
          pcVar2[(int)local_54] = (char)((int)sVar1 << 2);
          break;
        case 1:
          pcVar2[(int)local_54] = pcVar2[(int)local_54] | (byte)(sVar1 >> 4);
          pcVar2[(int)(local_54 + 1)] = (char)((int)sVar1 << 4);
          local_54 = local_54 + 1;
          break;
        case 2:
          pcVar2[(int)local_54] = pcVar2[(int)local_54] | (byte)(sVar1 >> 2);
          pcVar2[(int)(local_54 + 1)] = (char)((int)sVar1 << 6);
          local_54 = local_54 + 1;
          break;
        case 3:
          pcVar2[(int)local_54] = pcVar2[(int)local_54] | (byte)sVar1;
          local_54 = local_54 + 1;
        }
        local_50 = local_50 + 1;
      }
    }
    if (local_50 % 4 == 1) {
      (*session->free)(*data,&session->abstract);
      session_local._4_4_ = _libssh2_error(session,-0x22,"Invalid base64");
    }
    else {
      *datalen = local_54;
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    unsigned char *s, *d;
    short v;
    int i = 0, len = 0;

    *data = LIBSSH2_ALLOC(session, (3 * src_len / 4) + 1);
    d = (unsigned char *) *data;
    if (!d) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for base64 decoding");
    }

    for(s = (unsigned char *) src; ((char *) s) < (src + src_len); s++) {
        if ((v = base64_reverse_table[*s]) < 0)
            continue;
        switch (i % 4) {
        case 0:
            d[len] = (unsigned char)(v << 2);
            break;
        case 1:
            d[len++] |= v >> 4;
            d[len] = (unsigned char)(v << 4);
            break;
        case 2:
            d[len++] |= v >> 2;
            d[len] = (unsigned char)(v << 6);
            break;
        case 3:
            d[len++] |= v;
            break;
        }
        i++;
    }
    if ((i % 4) == 1) {
        /* Invalid -- We have a byte which belongs exclusively to a partial
           octet */
        LIBSSH2_FREE(session, *data);
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL, "Invalid base64");
    }

    *datalen = len;
    return 0;
}